

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_utils.c
# Opt level: O0

char * vrna_dirname(char *path)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  char *pcStack_28;
  int pos;
  char *ptr;
  char *p;
  char *name;
  char *path_local;
  
  p = (char *)0x0;
  if (path != (char *)0x0) {
    iVar1 = is_absolute_path(path);
    if (iVar1 == 0) {
      pcStack_28 = vrna_strdup_printf(".%c%s",0x2f,path);
    }
    else {
      pcStack_28 = strdup(path);
    }
    sVar2 = strlen(pcStack_28);
    ptr = pcStack_28 + (int)sVar2;
    do {
      *ptr = '\0';
      ptr = ptr + -1;
      bVar3 = false;
      if (pcStack_28 < ptr) {
        bVar3 = *ptr != '/';
      }
    } while (bVar3);
    if (pcStack_28 < ptr) {
      p = pcStack_28;
    }
  }
  return p;
}

Assistant:

PUBLIC char *
vrna_dirname(const char *path)
{
  char  *name, *p, *ptr;
  int   pos;

  name = NULL;

  if (path) {
    if (!is_absolute_path(path))
      ptr = vrna_strdup_printf(".%c%s", DIRSEPC, path);
    else
      ptr = strdup(path);

    pos = (int)strlen(ptr);
    p   = ptr + pos;

    do  /* remove part after last separator */
      *p = '\0';
    while ((--p > ptr) && (*p != DIRSEPC));

    if (p > ptr)
      name = ptr;
  }

  return name;
}